

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

bool __thiscall
gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInVertexShaderTest
          (CoverageTest *this,Functions *gl)

{
  int iVar1;
  GLchar *pGVar2;
  GLenum err;
  size_t sVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> results;
  VertexArrayObject vertex_array_object;
  string transform_feedback_varying_name;
  string fragment_shader;
  string vertex_shader;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transform_feedback_varyings;
  Program program;
  VertexBufferObject<int> vertex_buffer_object;
  vector<int,_std::allocator<int>_> local_320;
  vector<int,_std::allocator<int>_> local_308;
  VertexArrayObject local_2f0;
  value_type local_2e0;
  string local_2c0;
  string local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  Program local_250;
  VertexBufferObject<int> local_1d0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,m_vertex_shader_code_case_0,(allocator<char> *)local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,m_fragment_shader_code_case_0,(allocator<char> *)local_1a0);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"max_value","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_268,1,&local_2e0,(allocator_type *)local_1a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_280,&local_268);
  Utility::Program::Program(&local_250,gl,&local_2a0,&local_2c0,&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280);
  if (local_250.m_program_status.program_id == 0) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Program failed to build.\n Vertex Shader:\n",0x29);
    pGVar2 = m_vertex_shader_code_case_0;
    iVar1 = (int)(ostringstream *)&local_198;
    if (m_vertex_shader_code_case_0 == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_198[-3]);
    }
    else {
      sVar3 = strlen(m_vertex_shader_code_case_0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pGVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nVertex Shader compilation log:\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,local_250.m_vertex_shader_status.shader_log._M_dataplus._M_p,
               local_250.m_vertex_shader_status.shader_log._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nWith Fragment Shader:\n",0x17);
    pGVar2 = m_fragment_shader_code_case_0;
    if (m_fragment_shader_code_case_0 == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_198[-3]);
    }
    else {
      sVar3 = strlen(m_fragment_shader_code_case_0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pGVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nWith Fragment Shader compilation log:\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,local_250.m_fragment_shader_status.shader_log._M_dataplus._M_p,
               local_250.m_fragment_shader_status.shader_log._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nWith Program linkage log:\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,local_250.m_fragment_shader_status.shader_log._M_dataplus._M_p,
               local_250.m_fragment_shader_status.shader_log._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    bVar4 = false;
    goto LAB_00a861c4;
  }
  (*(local_250.m_gl)->useProgram)(local_250.m_program_status.program_id);
  err = (*(local_250.m_gl)->getError)();
  glu::checkError(err,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5af);
  Utility::VertexArrayObject::VertexArrayObject(&local_2f0,gl,0);
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  Utility::VertexBufferObject<int>::VertexBufferObject(&local_1d0,gl,0x8c8e,&local_308);
  if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Utility::VertexArrayObject::drawWithTransformFeedback(&local_2f0,0,1,true);
  Utility::VertexBufferObject<int>::readBuffer(&local_320,&local_1d0);
  if (local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Results reading error.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a86033:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (*local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start != this->m_gl_max_clip_distances_value) {
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198,
                 "Vertex shader\'s gl_MaxClipDistances constant has improper value equal to ",0x49);
      std::ostream::operator<<
                ((ostringstream *)&local_198,
                 *local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"but ",4);
      std::ostream::operator<<((ostringstream *)&local_198,this->m_gl_max_clip_distances_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198,"is expected. Test failed.",0x19);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00a86033;
    }
  }
  if (local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Utility::VertexBufferObject<int>::~VertexBufferObject(&local_1d0);
  Utility::VertexArrayObject::~VertexArrayObject(&local_2f0);
LAB_00a861c4:
  Utility::Program::~Program(&local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInVertexShaderTest(const glw::Functions& gl)
{
	/*  Make a program that consist of vertex and fragment shader stages. A
	 vertex shader shall assign the value of gl_MaxClipDistances to transform
	 feedback output variable. Setup gl_Position with passed in attribute.
	 Use blank fragment shader. Check that the shaders compiles and links
	 successfully. Draw a single GL_POINT with screen centered position
	 attribute, a configured transform feedback and GL_RASTERIZER_DISCARD.
	 Query transform feedback value and compare it against
	 GL_MAX_CLIP_DISTANCES. Expect that both values are equal. */

	/* Building program. */
	const std::string vertex_shader					  = m_vertex_shader_code_case_0;
	const std::string fragment_shader				  = m_fragment_shader_code_case_0;
	std::string		  transform_feedback_varying_name = "max_value";

	std::vector<std::string> transform_feedback_varyings(1, transform_feedback_varying_name);

	gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader, fragment_shader, transform_feedback_varyings);

	if (program.ProgramStatus().program_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program failed to build.\n Vertex Shader:\n"
						   << m_vertex_shader_code_case_0 << "\nVertex Shader compilation log:\n"
						   << program.VertexShaderStatus().shader_log << "\nWith Fragment Shader:\n"
						   << m_fragment_shader_code_case_0 << "\nWith Fragment Shader compilation log:\n"
						   << program.FragmentShaderStatus().shader_log << "\nWith Program linkage log:\n"
						   << program.FragmentShaderStatus().shader_log << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	program.UseProgram();

	/* Creating and binding empty VAO. */
	gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, GL_POINTS);

	/* Creating and binding output VBO */
	gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLint> vertex_buffer_object(gl, GL_TRANSFORM_FEEDBACK_BUFFER,
																					   std::vector<glw::GLint>(1, 0));

	/* Draw test. */
	vertex_array_object.drawWithTransformFeedback(0, 1, true);

	/* Check results. */
	std::vector<glw::GLint> results = vertex_buffer_object.readBuffer();

	if (results.size() < 1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Results reading error." << tcu::TestLog::EndMessage;
		return false;
	}

	if (results[0] != m_gl_max_clip_distances_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Vertex shader's gl_MaxClipDistances constant has improper value equal to " << results[0]
						   << "but " << m_gl_max_clip_distances_value << "is expected. Test failed."
						   << tcu::TestLog::EndMessage;
		return false;
	}

	/* Test passed. */
	return true;
}